

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

char * __thiscall tinyxml2::XMLElement::GetText(XMLElement *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLNode *local_20;
  XMLNode *node;
  XMLElement *this_local;
  
  local_20 = XMLNode::FirstChild(&this->super_XMLNode);
  while ((local_20 != (XMLNode *)0x0 &&
         (iVar1 = (*local_20->_vptr_XMLNode[8])(), CONCAT44(extraout_var,iVar1) != 0))) {
    local_20 = XMLNode::NextSibling(local_20);
  }
  if ((local_20 == (XMLNode *)0x0) ||
     (iVar1 = (*local_20->_vptr_XMLNode[7])(), CONCAT44(extraout_var_00,iVar1) == 0)) {
    this_local = (XMLElement *)0x0;
  }
  else {
    this_local = (XMLElement *)XMLNode::Value(local_20);
  }
  return (char *)this_local;
}

Assistant:

const char* XMLElement::GetText() const
{
    /* skip comment node */
    const XMLNode* node = FirstChild();
    while (node) {
        if (node->ToComment()) {
            node = node->NextSibling();
            continue;
        }
        break;
    }

    if ( node && node->ToText() ) {
        return node->Value();
    }
    return 0;
}